

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::js::Generator::GenerateOneofCaseDefinition
          (Generator *this,GeneratorOptions *options,Printer *printer,OneofDescriptor *oneof)

{
  bool bVar1;
  int iVar2;
  string *descriptor;
  FieldDescriptor *this_00;
  _Base_ptr in_RCX;
  GeneratorOptions *in_RDX;
  char (*in_RSI) [7];
  int i;
  char *varname;
  Printer *this_01;
  string *in_stack_fffffffffffffe98;
  GeneratorOptions *input;
  undefined4 in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeac;
  int iVar3;
  Descriptor *in_stack_fffffffffffffeb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffec8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffed0;
  char (*in_stack_fffffffffffffed8) [6];
  Printer *in_stack_fffffffffffffee0;
  char (*in_stack_fffffffffffffee8) [10];
  char *in_stack_fffffffffffffef0;
  Printer *in_stack_fffffffffffffef8;
  string local_f8 [8];
  char (*in_stack_ffffffffffffff10) [11];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  string local_d8 [32];
  string local_b8 [36];
  int local_94;
  undefined1 local_90 [80];
  string local_40 [32];
  _Base_ptr local_20;
  GeneratorOptions *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  OneofDescriptor::containing_type((OneofDescriptor *)in_RCX);
  (anonymous_namespace)::GetMessagePath_abi_cxx11_(in_RDX,in_stack_fffffffffffffeb0);
  (anonymous_namespace)::JSOneofName_abi_cxx11_
            ((OneofDescriptor *)CONCAT44(in_stack_fffffffffffffeac,in_stack_fffffffffffffea8));
  descriptor = OneofDescriptor::name_abi_cxx11_((OneofDescriptor *)local_20);
  anon_unknown_0::ToEnumCase(in_stack_fffffffffffffe98);
  this_01 = (Printer *)local_90;
  varname = "upcase";
  io::Printer::
  Print<char[10],std::__cxx11::string,char[6],std::__cxx11::string,char[7],std::__cxx11::string>
            (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
             (char (*) [7])in_stack_ffffffffffffff10,in_stack_ffffffffffffff18);
  std::__cxx11::string::~string((string *)local_90);
  std::__cxx11::string::~string((string *)(local_90 + 0x30));
  std::__cxx11::string::~string(local_40);
  local_94 = 0;
  while (iVar3 = local_94, iVar2 = OneofDescriptor::field_count((OneofDescriptor *)local_20),
        iVar3 < iVar2) {
    OneofDescriptor::field((OneofDescriptor *)local_20,local_94);
    bVar1 = anon_unknown_0::IgnoreField((FieldDescriptor *)0x468c90);
    if (!bVar1) {
      input = local_18;
      this_00 = OneofDescriptor::field((OneofDescriptor *)local_20,local_94);
      FieldDescriptor::name_abi_cxx11_(this_00);
      anon_unknown_0::ToEnumCase(&input->output_dir);
      OneofDescriptor::field((OneofDescriptor *)local_20,local_94);
      (anonymous_namespace)::JSFieldIndex_abi_cxx11_((FieldDescriptor *)in_stack_fffffffffffffef8);
      io::Printer::Print<char[7],std::__cxx11::string,char[7],std::__cxx11::string>
                (in_stack_fffffffffffffee0,*in_stack_fffffffffffffed8,
                 (char (*) [7])in_stack_fffffffffffffed0,in_stack_fffffffffffffec8,in_RSI,
                 &in_RDX->output_dir);
      std::__cxx11::string::~string(local_d8);
      std::__cxx11::string::~string(local_b8);
      OneofDescriptor::field((OneofDescriptor *)local_20,local_94);
      io::Printer::Annotate<google::protobuf::FieldDescriptor>
                (this_01,varname,(FieldDescriptor *)0x468def);
    }
    local_94 = local_94 + 1;
  }
  OneofDescriptor::containing_type((OneofDescriptor *)local_20);
  (anonymous_namespace)::GetMessagePath_abi_cxx11_(in_RDX,(Descriptor *)descriptor);
  (anonymous_namespace)::JSOneofName_abi_cxx11_
            ((OneofDescriptor *)CONCAT44(iVar3,in_stack_fffffffffffffea8));
  (anonymous_namespace)::JSOneofIndex_abi_cxx11_((OneofDescriptor *)in_stack_fffffffffffffec8);
  io::Printer::
  Print<char[6],std::__cxx11::string,char[6],std::__cxx11::string,char[11],std::__cxx11::string>
            (in_stack_fffffffffffffef8,in_stack_fffffffffffffef0,
             (char (*) [6])in_stack_fffffffffffffee8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,
             in_stack_ffffffffffffff10,in_stack_ffffffffffffff18);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffec8);
  std::__cxx11::string::~string((string *)&stack0xfffffffffffffee8);
  std::__cxx11::string::~string(local_f8);
  return;
}

Assistant:

void Generator::GenerateOneofCaseDefinition(
    const GeneratorOptions& options, io::Printer* printer,
    const OneofDescriptor* oneof) const {
  printer->Print(
      "/**\n"
      " * @enum {number}\n"
      " */\n"
      "$classname$.$oneof$Case = {\n"
      "  $upcase$_NOT_SET: 0",
      "classname", GetMessagePath(options, oneof->containing_type()), "oneof",
      JSOneofName(oneof), "upcase", ToEnumCase(oneof->name()));

  for (int i = 0; i < oneof->field_count(); i++) {
    if (IgnoreField(oneof->field(i))) {
      continue;
    }

    printer->Print(
        ",\n"
        "  $upcase$: $number$",
        "upcase", ToEnumCase(oneof->field(i)->name()), "number",
        JSFieldIndex(oneof->field(i)));
    printer->Annotate("upcase", oneof->field(i));
  }

  printer->Print(
      "\n"
      "};\n"
      "\n"
      "/**\n"
      " * @return {$class$.$oneof$Case}\n"
      " */\n"
      "$class$.prototype.get$oneof$Case = function() {\n"
      "  return /** @type {$class$.$oneof$Case} */(jspb.Message."
      "computeOneofCase(this, $class$.oneofGroups_[$oneofindex$]));\n"
      "};\n"
      "\n",
      "class", GetMessagePath(options, oneof->containing_type()), "oneof",
      JSOneofName(oneof), "oneofindex", JSOneofIndex(oneof));
}